

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O2

Token * __thiscall rsg::Token::operator=(Token *this,Token *other)

{
  Type TVar1;
  char *pcVar2;
  undefined8 *puVar3;
  
  if (this->m_type == IDENTIFIER) {
    deFree((this->m_arg).identifier);
    (this->m_arg).identifier = (char *)0x0;
  }
  TVar1 = other->m_type;
  this->m_type = TVar1;
  if (TVar1 == BOOL_LITERAL) {
    (this->m_arg).boolValue = (other->m_arg).boolValue;
  }
  else if (TVar1 == FLOAT_LITERAL) {
    (this->m_arg).floatValue = (other->m_arg).floatValue;
  }
  else if (TVar1 == INT_LITERAL) {
    (this->m_arg).floatValue = (other->m_arg).floatValue;
  }
  else if (TVar1 == IDENTIFIER) {
    pcVar2 = deStrdup((other->m_arg).identifier);
    (this->m_arg).identifier = pcVar2;
    if (pcVar2 == (char *)0x0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = strcpy;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return this;
}

Assistant:

Token& Token::operator= (const Token& other)
{
	if (m_type == IDENTIFIER)
	{
		deFree(m_arg.identifier);
		m_arg.identifier = DE_NULL;
	}

	m_type = other.m_type;

	if (m_type == IDENTIFIER)
	{
		m_arg.identifier = deStrdup(other.m_arg.identifier);
		if (!m_arg.identifier)
			throw std::bad_alloc();
	}
	else if (m_type == FLOAT_LITERAL)
		m_arg.floatValue = other.m_arg.floatValue;
	else if (m_type == INT_LITERAL)
		m_arg.intValue = other.m_arg.intValue;
	else if (m_type == BOOL_LITERAL)
		m_arg.boolValue = other.m_arg.boolValue;

	return *this;
}